

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O1

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  pointer pcVar1;
  aiTextureMapMode aVar2;
  int iVar3;
  ai_real aVar4;
  bool bVar5;
  undefined3 uVar6;
  ai_real aVar7;
  ai_real aVar8;
  ai_real aVar9;
  
  this->_vptr_Material = (_func_int **)&PTR__Material_007fe7a8;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (other->mName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + (other->mName)._M_string_length);
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  aVar4 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar4;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  aVar4 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar4;
  (this->sTexDiffuse).mTextureBlend = (other->sTexDiffuse).mTextureBlend;
  (this->sTexDiffuse).mMapName._M_dataplus._M_p = (pointer)&(this->sTexDiffuse).mMapName.field_2;
  pcVar1 = (other->sTexDiffuse).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexDiffuse).mMapName,pcVar1,
             pcVar1 + (other->sTexDiffuse).mMapName._M_string_length);
  aVar4 = (other->sTexDiffuse).mOffsetU;
  aVar7 = (other->sTexDiffuse).mOffsetV;
  aVar8 = (other->sTexDiffuse).mScaleU;
  aVar9 = (other->sTexDiffuse).mScaleV;
  aVar2 = (other->sTexDiffuse).mMapMode;
  bVar5 = (other->sTexDiffuse).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexDiffuse).field_0x41;
  iVar3 = (other->sTexDiffuse).iUVSrc;
  (this->sTexDiffuse).mRotation = (other->sTexDiffuse).mRotation;
  (this->sTexDiffuse).mMapMode = aVar2;
  (this->sTexDiffuse).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexDiffuse).field_0x41 = uVar6;
  (this->sTexDiffuse).iUVSrc = iVar3;
  (this->sTexDiffuse).mOffsetU = aVar4;
  (this->sTexDiffuse).mOffsetV = aVar7;
  (this->sTexDiffuse).mScaleU = aVar8;
  (this->sTexDiffuse).mScaleV = aVar9;
  (this->sTexOpacity).mTextureBlend = (other->sTexOpacity).mTextureBlend;
  (this->sTexOpacity).mMapName._M_dataplus._M_p = (pointer)&(this->sTexOpacity).mMapName.field_2;
  pcVar1 = (other->sTexOpacity).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexOpacity).mMapName,pcVar1,
             pcVar1 + (other->sTexOpacity).mMapName._M_string_length);
  aVar4 = (other->sTexOpacity).mOffsetU;
  aVar7 = (other->sTexOpacity).mOffsetV;
  aVar8 = (other->sTexOpacity).mScaleU;
  aVar9 = (other->sTexOpacity).mScaleV;
  aVar2 = (other->sTexOpacity).mMapMode;
  bVar5 = (other->sTexOpacity).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexOpacity).field_0x41;
  iVar3 = (other->sTexOpacity).iUVSrc;
  (this->sTexOpacity).mRotation = (other->sTexOpacity).mRotation;
  (this->sTexOpacity).mMapMode = aVar2;
  (this->sTexOpacity).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexOpacity).field_0x41 = uVar6;
  (this->sTexOpacity).iUVSrc = iVar3;
  (this->sTexOpacity).mOffsetU = aVar4;
  (this->sTexOpacity).mOffsetV = aVar7;
  (this->sTexOpacity).mScaleU = aVar8;
  (this->sTexOpacity).mScaleV = aVar9;
  (this->sTexSpecular).mTextureBlend = (other->sTexSpecular).mTextureBlend;
  (this->sTexSpecular).mMapName._M_dataplus._M_p = (pointer)&(this->sTexSpecular).mMapName.field_2;
  pcVar1 = (other->sTexSpecular).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexSpecular).mMapName,pcVar1,
             pcVar1 + (other->sTexSpecular).mMapName._M_string_length);
  aVar4 = (other->sTexSpecular).mOffsetU;
  aVar7 = (other->sTexSpecular).mOffsetV;
  aVar8 = (other->sTexSpecular).mScaleU;
  aVar9 = (other->sTexSpecular).mScaleV;
  aVar2 = (other->sTexSpecular).mMapMode;
  bVar5 = (other->sTexSpecular).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexSpecular).field_0x41;
  iVar3 = (other->sTexSpecular).iUVSrc;
  (this->sTexSpecular).mRotation = (other->sTexSpecular).mRotation;
  (this->sTexSpecular).mMapMode = aVar2;
  (this->sTexSpecular).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexSpecular).field_0x41 = uVar6;
  (this->sTexSpecular).iUVSrc = iVar3;
  (this->sTexSpecular).mOffsetU = aVar4;
  (this->sTexSpecular).mOffsetV = aVar7;
  (this->sTexSpecular).mScaleU = aVar8;
  (this->sTexSpecular).mScaleV = aVar9;
  (this->sTexReflective).mTextureBlend = (other->sTexReflective).mTextureBlend;
  (this->sTexReflective).mMapName._M_dataplus._M_p =
       (pointer)&(this->sTexReflective).mMapName.field_2;
  pcVar1 = (other->sTexReflective).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexReflective).mMapName,pcVar1,
             pcVar1 + (other->sTexReflective).mMapName._M_string_length);
  aVar4 = (other->sTexReflective).mOffsetU;
  aVar7 = (other->sTexReflective).mOffsetV;
  aVar8 = (other->sTexReflective).mScaleU;
  aVar9 = (other->sTexReflective).mScaleV;
  aVar2 = (other->sTexReflective).mMapMode;
  bVar5 = (other->sTexReflective).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexReflective).field_0x41;
  iVar3 = (other->sTexReflective).iUVSrc;
  (this->sTexReflective).mRotation = (other->sTexReflective).mRotation;
  (this->sTexReflective).mMapMode = aVar2;
  (this->sTexReflective).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexReflective).field_0x41 = uVar6;
  (this->sTexReflective).iUVSrc = iVar3;
  (this->sTexReflective).mOffsetU = aVar4;
  (this->sTexReflective).mOffsetV = aVar7;
  (this->sTexReflective).mScaleU = aVar8;
  (this->sTexReflective).mScaleV = aVar9;
  (this->sTexBump).mTextureBlend = (other->sTexBump).mTextureBlend;
  (this->sTexBump).mMapName._M_dataplus._M_p = (pointer)&(this->sTexBump).mMapName.field_2;
  pcVar1 = (other->sTexBump).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexBump).mMapName,pcVar1,
             pcVar1 + (other->sTexBump).mMapName._M_string_length);
  aVar4 = (other->sTexBump).mOffsetU;
  aVar7 = (other->sTexBump).mOffsetV;
  aVar8 = (other->sTexBump).mScaleU;
  aVar9 = (other->sTexBump).mScaleV;
  aVar2 = (other->sTexBump).mMapMode;
  bVar5 = (other->sTexBump).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexBump).field_0x41;
  iVar3 = (other->sTexBump).iUVSrc;
  (this->sTexBump).mRotation = (other->sTexBump).mRotation;
  (this->sTexBump).mMapMode = aVar2;
  (this->sTexBump).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexBump).field_0x41 = uVar6;
  (this->sTexBump).iUVSrc = iVar3;
  (this->sTexBump).mOffsetU = aVar4;
  (this->sTexBump).mOffsetV = aVar7;
  (this->sTexBump).mScaleU = aVar8;
  (this->sTexBump).mScaleV = aVar9;
  (this->sTexEmissive).mTextureBlend = (other->sTexEmissive).mTextureBlend;
  (this->sTexEmissive).mMapName._M_dataplus._M_p = (pointer)&(this->sTexEmissive).mMapName.field_2;
  pcVar1 = (other->sTexEmissive).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexEmissive).mMapName,pcVar1,
             pcVar1 + (other->sTexEmissive).mMapName._M_string_length);
  aVar4 = (other->sTexEmissive).mOffsetU;
  aVar7 = (other->sTexEmissive).mOffsetV;
  aVar8 = (other->sTexEmissive).mScaleU;
  aVar9 = (other->sTexEmissive).mScaleV;
  aVar2 = (other->sTexEmissive).mMapMode;
  bVar5 = (other->sTexEmissive).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexEmissive).field_0x41;
  iVar3 = (other->sTexEmissive).iUVSrc;
  (this->sTexEmissive).mRotation = (other->sTexEmissive).mRotation;
  (this->sTexEmissive).mMapMode = aVar2;
  (this->sTexEmissive).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexEmissive).field_0x41 = uVar6;
  (this->sTexEmissive).iUVSrc = iVar3;
  (this->sTexEmissive).mOffsetU = aVar4;
  (this->sTexEmissive).mOffsetV = aVar7;
  (this->sTexEmissive).mScaleU = aVar8;
  (this->sTexEmissive).mScaleV = aVar9;
  (this->sTexShininess).mTextureBlend = (other->sTexShininess).mTextureBlend;
  (this->sTexShininess).mMapName._M_dataplus._M_p = (pointer)&(this->sTexShininess).mMapName.field_2
  ;
  pcVar1 = (other->sTexShininess).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexShininess).mMapName,pcVar1,
             pcVar1 + (other->sTexShininess).mMapName._M_string_length);
  aVar4 = (other->sTexShininess).mOffsetU;
  aVar7 = (other->sTexShininess).mOffsetV;
  aVar8 = (other->sTexShininess).mScaleU;
  aVar9 = (other->sTexShininess).mScaleV;
  aVar2 = (other->sTexShininess).mMapMode;
  bVar5 = (other->sTexShininess).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexShininess).field_0x41;
  iVar3 = (other->sTexShininess).iUVSrc;
  (this->sTexShininess).mRotation = (other->sTexShininess).mRotation;
  (this->sTexShininess).mMapMode = aVar2;
  (this->sTexShininess).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexShininess).field_0x41 = uVar6;
  (this->sTexShininess).iUVSrc = iVar3;
  (this->sTexShininess).mOffsetU = aVar4;
  (this->sTexShininess).mOffsetV = aVar7;
  (this->sTexShininess).mScaleU = aVar8;
  (this->sTexShininess).mScaleV = aVar9;
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  (this->sTexAmbient).mTextureBlend = (other->sTexAmbient).mTextureBlend;
  (this->sTexAmbient).mMapName._M_dataplus._M_p = (pointer)&(this->sTexAmbient).mMapName.field_2;
  pcVar1 = (other->sTexAmbient).mMapName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sTexAmbient).mMapName,pcVar1,
             pcVar1 + (other->sTexAmbient).mMapName._M_string_length);
  aVar4 = (other->sTexAmbient).mOffsetU;
  aVar7 = (other->sTexAmbient).mOffsetV;
  aVar8 = (other->sTexAmbient).mScaleU;
  aVar9 = (other->sTexAmbient).mScaleV;
  aVar2 = (other->sTexAmbient).mMapMode;
  bVar5 = (other->sTexAmbient).bPrivate;
  uVar6 = *(undefined3 *)&(other->sTexAmbient).field_0x41;
  iVar3 = (other->sTexAmbient).iUVSrc;
  (this->sTexAmbient).mRotation = (other->sTexAmbient).mRotation;
  (this->sTexAmbient).mMapMode = aVar2;
  (this->sTexAmbient).bPrivate = bVar5;
  *(undefined3 *)&(this->sTexAmbient).field_0x41 = uVar6;
  (this->sTexAmbient).iUVSrc = iVar3;
  (this->sTexAmbient).mOffsetU = aVar4;
  (this->sTexAmbient).mOffsetV = aVar7;
  (this->sTexAmbient).mScaleU = aVar8;
  (this->sTexAmbient).mScaleV = aVar9;
  this->mTwoSided = other->mTwoSided;
  return;
}

Assistant:

Material(const Material &other)            = default;